

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_netstd_union_reader
          (t_netstd_generator *this,ostream *out,t_struct *tunion)

{
  int *piVar1;
  t_field *tfield;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *this_00;
  pointer pptVar4;
  string tmpvar;
  string tmpRetval;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_generator::indent_abi_cxx11_(&tmpRetval,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpRetval);
  poVar3 = std::operator<<(poVar3,"public static async Task<");
  iVar2 = (*(tunion->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  poVar3 = std::operator<<(poVar3,"> ReadAsync(TProtocol iprot, CancellationToken ");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,")");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpRetval);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&tmpRetval,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpRetval);
  poVar3 = std::operator<<(poVar3,"iprot.IncrementRecursionDepth();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpRetval);
  t_generator::indent_abi_cxx11_(&tmpRetval,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpRetval);
  poVar3 = std::operator<<(poVar3,"try");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpRetval);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  std::__cxx11::string::string((string *)&local_f0,"tmp",(allocator *)&tmpvar);
  t_generator::tmp(&tmpRetval,(t_generator *)this,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  iVar2 = (*(tunion->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar2));
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,(string *)&tmpRetval);
  poVar3 = std::operator<<(poVar3,";");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"await iprot.ReadStructBeginAsync(");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"TField field = await iprot.ReadFieldBeginAsync(");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"if (field.Type == TType.Stop)");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"await iprot.ReadFieldEndAsync(");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"");
  poVar3 = std::operator<<(poVar3,(string *)&tmpRetval);
  poVar3 = std::operator<<(poVar3," = new ___undefined();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"else");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"switch (field.ID)");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  for (pptVar4 = (tunion->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (tunion->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&tmpvar);
    poVar3 = std::operator<<(poVar3,"case ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*pptVar4)->key_);
    poVar3 = std::operator<<(poVar3,":");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&tmpvar);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&tmpvar);
    this_00 = "if (field.Type == ";
    poVar3 = std::operator<<(poVar3,"if (field.Type == ");
    type_to_enum_abi_cxx11_(&local_130,(t_netstd_generator *)this_00,(*pptVar4)->type_);
    poVar3 = std::operator<<(poVar3,(string *)&local_130);
    poVar3 = std::operator<<(poVar3,") {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&tmpvar);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    std::__cxx11::string::string((string *)&local_50,"tmp",(allocator *)&local_130);
    t_generator::tmp(&tmpvar,(t_generator *)this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_130);
    type_name_abi_cxx11_(&local_110,this,(*pptVar4)->type_,true);
    poVar3 = std::operator<<(poVar3,(string *)&local_110);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)&tmpvar);
    poVar3 = std::operator<<(poVar3,";");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    tfield = *pptVar4;
    std::__cxx11::string::string((string *)&local_70,(string *)&tmpvar);
    generate_deserialize_field(this,out,tfield,&local_70,true);
    std::__cxx11::string::~string((string *)&local_70);
    t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_130);
    poVar3 = std::operator<<(poVar3,(string *)&tmpRetval);
    poVar3 = std::operator<<(poVar3," = new ");
    poVar3 = std::operator<<(poVar3,(string *)&(*pptVar4)->name_);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = std::operator<<(poVar3,(string *)&tmpvar);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_130);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_130);
    poVar3 = std::operator<<(poVar3,"} else { ");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_110);
    poVar3 = std::operator<<(poVar3," await TProtocolUtil.SkipAsync(iprot, field.Type, ");
    poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,");");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_90);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = std::operator<<(poVar3,(string *)&tmpRetval);
    poVar3 = std::operator<<(poVar3," = new ___undefined();");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_b0);
    poVar3 = std::operator<<(poVar3,"}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_d0);
    poVar3 = std::operator<<(poVar3,"break;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    std::__cxx11::string::~string((string *)&tmpvar);
  }
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"default: ");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"await TProtocolUtil.SkipAsync(iprot, field.Type, ");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_130);
  poVar3 = std::operator<<(poVar3,(string *)&tmpRetval);
  poVar3 = std::operator<<(poVar3," = new ___undefined();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&tmpvar);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"break;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"await iprot.ReadFieldEndAsync(");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"if ((await iprot.ReadFieldBeginAsync(");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,")).Type != TType.Stop)");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"throw new TProtocolException(TProtocolException.INVALID_DATA);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"await iprot.ReadStructEndAsync(");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"return ");
  poVar3 = std::operator<<(poVar3,(string *)&tmpRetval);
  poVar3 = std::operator<<(poVar3,";");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"finally");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"iprot.DecrementRecursionDepth();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&tmpvar);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  std::__cxx11::string::~string((string *)&tmpRetval);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_union_reader(ostream& out, t_struct* tunion)
{
    // Thanks to THRIFT-1768, we don't need to check for required fields in the union
    const vector<t_field*>& fields = tunion->get_members();
    vector<t_field*>::const_iterator f_iter;

    out << indent() << "public static async Task<" << tunion->get_name() << "> ReadAsync(TProtocol iprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl;
    scope_up(out);

    out << indent() << "iprot.IncrementRecursionDepth();" << endl;
    out << indent() << "try" << endl;
    scope_up(out);

    string tmpRetval = tmp("tmp");
    out << indent() << tunion->get_name() << " " << tmpRetval << ";" << endl;
    out << indent() << "await iprot.ReadStructBeginAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    out << indent() << "TField field = await iprot.ReadFieldBeginAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    // we cannot have the first field be a stop -- we must have a single field defined
    out << indent() << "if (field.Type == TType.Stop)" << endl;
    scope_up(out);
    out << indent() << "await iprot.ReadFieldEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    out << indent() << "" << tmpRetval << " = new ___undefined();" << endl;
    scope_down(out);
    out << indent() << "else" << endl;
    scope_up(out);
    out << indent() << "switch (field.ID)" << endl;
    scope_up(out);

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        out << indent() << "case " << (*f_iter)->get_key() << ":" << endl;
        indent_up();
        out << indent() << "if (field.Type == " << type_to_enum((*f_iter)->get_type()) << ") {" << endl;
        indent_up();

        string tmpvar = tmp("tmp");
        out << indent() << type_name((*f_iter)->get_type()) << " " << tmpvar << ";" << endl;
        generate_deserialize_field(out, (*f_iter), tmpvar, true);
        out << indent() << tmpRetval << " = new " << (*f_iter)->get_name() << "(" << tmpvar << ");" << endl;

        indent_down();
        out << indent() << "} else { " << endl << indent() << " await TProtocolUtil.SkipAsync(iprot, field.Type, " << CANCELLATION_TOKEN_NAME << ");"
            << endl << indent() << "  " << tmpRetval << " = new ___undefined();" << endl << indent() << "}" << endl
            << indent() << "break;" << endl;
        indent_down();
    }

    out << indent() << "default: " << endl;
    indent_up();
    out << indent() << "await TProtocolUtil.SkipAsync(iprot, field.Type, " << CANCELLATION_TOKEN_NAME << ");" << endl << indent()
        << tmpRetval << " = new ___undefined();" << endl;
    out << indent() << "break;" << endl;
    indent_down();

    scope_down(out);

    out << indent() << "await iprot.ReadFieldEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;

    out << indent() << "if ((await iprot.ReadFieldBeginAsync(" << CANCELLATION_TOKEN_NAME << ")).Type != TType.Stop)" << endl;
    scope_up(out);
    out << indent() << "throw new TProtocolException(TProtocolException.INVALID_DATA);" << endl;
    scope_down(out);

    // end of else for TStop
    scope_down(out);
    out << indent() << "await iprot.ReadStructEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    out << indent() << "return " << tmpRetval << ";" << endl;
    indent_down();

    scope_down(out);
    out << indent() << "finally" << endl;
    scope_up(out);
    out << indent() << "iprot.DecrementRecursionDepth();" << endl;
    scope_down(out);

    out << indent() << "}" << endl << endl;
}